

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

void setseed(lua_State *L,unsigned_long *state,lua_Unsigned n1,lua_Unsigned n2)

{
  ulong uVar1;
  int iVar2;
  lua_Unsigned lVar3;
  ulong uVar4;
  ulong uVar5;
  lua_Unsigned lVar6;
  ulong uVar7;
  
  iVar2 = 0x10;
  uVar1 = 0;
  lVar3 = n1;
  uVar4 = 0xff;
  lVar6 = n2;
  do {
    uVar7 = lVar6 ^ lVar3;
    uVar1 = uVar1 ^ uVar4;
    lVar3 = lVar3 ^ uVar1;
    uVar5 = uVar7 ^ uVar4;
    lVar6 = uVar4 << 0x11 ^ uVar7;
    uVar1 = uVar1 << 0x2d | uVar1 >> 0x13;
    iVar2 = iVar2 + -1;
    uVar4 = uVar5;
  } while (iVar2 != 0);
  *state = lVar3;
  state[1] = uVar5;
  state[2] = lVar6;
  state[3] = uVar1;
  lua_pushinteger(L,n1);
  lua_pushinteger(L,n2);
  return;
}

Assistant:

static void setseed (lua_State *L, Rand64 *state,
                     lua_Unsigned n1, lua_Unsigned n2) {
  int i;
  state[0] = Int2I(n1);
  state[1] = Int2I(0xff);  /* avoid a zero state */
  state[2] = Int2I(n2);
  state[3] = Int2I(0);
  for (i = 0; i < 16; i++)
    nextrand(state);  /* discard initial values to "spread" seed */
  lua_pushinteger(L, l_castU2S(n1));
  lua_pushinteger(L, l_castU2S(n2));
}